

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O2

void Abc_NtkTimePrint(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  char *pcVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  
  if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
    printf("Default arrival = %8f\n",(double)(pNtk->pManTime->tArrDef).Fall);
    printf("Default required = %8f\n",(double)(pNtk->pManTime->tReqDef).Fall);
    printf("Inputs (%d):\n",(ulong)(uint)pNtk->vCis->nSize);
    for (iVar3 = 0; iVar3 < pNtk->vCis->nSize; iVar3 = iVar3 + 1) {
      pAVar1 = Abc_NtkCi(pNtk,iVar3);
      pcVar2 = Abc_ObjName(pAVar1);
      fVar4 = Abc_NodeReadArrivalWorst(pAVar1);
      fVar5 = Abc_NodeReadRequiredWorst(pAVar1);
      printf("%20s   arrival = %8f   required = %8f\n",(double)fVar4,(double)fVar5,pcVar2);
    }
    printf("Outputs (%d):\n",(ulong)(uint)pNtk->vCos->nSize);
    for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
      pAVar1 = Abc_NtkCo(pNtk,iVar3);
      pcVar2 = Abc_ObjName(pAVar1);
      fVar4 = Abc_NodeReadArrivalWorst(pAVar1);
      fVar5 = Abc_NodeReadRequiredWorst(pAVar1);
      printf("%20s   arrival = %8f   required = %8f\n",(double)fVar4,(double)fVar5,pcVar2);
    }
    return;
  }
  puts("There is no timing manager");
  return;
}

Assistant:

void Abc_NtkTimePrint( Abc_Ntk_t * pNtk )
{
    if ( pNtk->pManTime == NULL )
        printf( "There is no timing manager\n" );
    else
    {
        Abc_Obj_t * pObj; int i;
        printf( "Default arrival = %8f\n", pNtk->pManTime->tArrDef.Fall );
        printf( "Default required = %8f\n", pNtk->pManTime->tReqDef.Fall );
        printf( "Inputs (%d):\n", Abc_NtkCiNum(pNtk) );
        Abc_NtkForEachCi( pNtk, pObj, i )
            printf( "%20s   arrival = %8f   required = %8f\n", 
                Abc_ObjName(pObj), 
                Abc_NodeReadArrivalWorst(pObj), 
                Abc_NodeReadRequiredWorst(pObj) );
        printf( "Outputs (%d):\n", Abc_NtkCoNum(pNtk) );
        Abc_NtkForEachCo( pNtk, pObj, i )
            printf( "%20s   arrival = %8f   required = %8f\n", 
                Abc_ObjName(pObj), 
                Abc_NodeReadArrivalWorst(pObj), 
                Abc_NodeReadRequiredWorst(pObj) );
    }
}